

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_refit.cpp
# Opt level: O3

BBox3fa * __thiscall
embree::avx::BVHNRefitter<8>::recurse_bottom
          (BBox3fa *__return_storage_ptr__,BVHNRefitter<8> *this,NodeRef *ref)

{
  long lVar1;
  ulong uVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  long lVar17;
  BBox3fa bounds [8];
  undefined1 local_168 [16];
  undefined1 auStack_158 [16];
  undefined1 local_148 [16];
  undefined1 auStack_138 [16];
  undefined1 local_128 [16];
  undefined1 auStack_118 [16];
  undefined1 local_108 [16];
  undefined1 auStack_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_48;
  undefined8 uStack_38;
  undefined8 uStack_30;
  
  uVar2 = ref->ptr;
  if ((uVar2 & 8) == 0) {
    lVar17 = 0;
    do {
      if (*(long *)(uVar2 + lVar17) == 8) {
        lVar1 = lVar17 * 4;
        *(undefined4 *)(local_168 + lVar1) = 0x7f800000;
        *(undefined4 *)(local_168 + lVar1 + 4) = 0x7f800000;
        *(undefined4 *)(local_168 + lVar1 + 8) = 0x7f800000;
        *(undefined4 *)(auStack_158 + lVar1 + -4) = 0x7f800000;
        lVar1 = lVar17 * 4;
        *(undefined4 *)(auStack_158 + lVar1) = 0xff800000;
        *(undefined4 *)(auStack_158 + lVar1 + 4) = 0xff800000;
        *(undefined4 *)(auStack_158 + lVar1 + 8) = 0xff800000;
        *(undefined4 *)(local_148 + lVar1 + -4) = 0xff800000;
      }
      else {
        recurse_bottom((BBox3fa *)&local_48.field_1,this,(NodeRef *)(uVar2 + lVar17));
        lVar1 = lVar17 * 4;
        *(undefined8 *)(local_168 + lVar1) = local_48._0_8_;
        *(undefined8 *)(local_168 + lVar1 + 8) = local_48._8_8_;
        *(undefined8 *)(auStack_158 + lVar1) = uStack_38;
        *(undefined8 *)(auStack_158 + lVar1 + 8) = uStack_30;
      }
      lVar17 = lVar17 + 8;
    } while (lVar17 != 0x40);
    auVar11._16_16_ = auStack_158;
    auVar11._0_16_ = local_168;
    auVar11 = vperm2f128_avx(ZEXT1632(local_e8),auVar11,2);
    auVar9._16_16_ = auStack_138;
    auVar9._0_16_ = local_148;
    auVar12 = vperm2f128_avx(ZEXT1632(local_c8),auVar9,2);
    auVar14._16_16_ = auStack_118;
    auVar14._0_16_ = local_128;
    auVar13 = vperm2f128_avx(ZEXT1632(local_a8),auVar14,2);
    auVar10._16_16_ = auStack_f8;
    auVar10._0_16_ = local_108;
    auVar14 = vperm2f128_avx(ZEXT1632(local_88),auVar10,2);
    auVar9 = vunpcklps_avx(auVar11,auVar13);
    auVar11 = vunpckhps_avx(auVar11,auVar13);
    auVar13 = vunpcklps_avx(auVar12,auVar14);
    auVar12 = vunpckhps_avx(auVar12,auVar14);
    auVar14 = vunpcklps_avx(auVar11,auVar12);
    auVar10 = vunpcklps_avx(auVar9,auVar13);
    auVar12._16_16_ = local_148;
    auVar12._0_16_ = auStack_158;
    auVar12 = vperm2f128_avx(ZEXT1632(local_d8),auVar12,2);
    auVar11 = vunpckhps_avx(auVar9,auVar13);
    auVar13._16_16_ = local_128;
    auVar13._0_16_ = auStack_138;
    auVar9 = vperm2f128_avx(ZEXT1632(local_b8),auVar13,2);
    auVar15._16_16_ = local_108;
    auVar15._0_16_ = auStack_118;
    auVar15 = vperm2f128_avx(ZEXT1632(local_98),auVar15,2);
    auVar16._16_16_ = local_e8;
    auVar16._0_16_ = auStack_f8;
    auVar16 = vperm2f128_avx(ZEXT1632(local_78),auVar16,2);
    auVar13 = vunpcklps_avx(auVar12,auVar15);
    auVar12 = vunpckhps_avx(auVar12,auVar15);
    auVar15 = vunpcklps_avx(auVar9,auVar16);
    auVar9 = vunpckhps_avx(auVar9,auVar16);
    auVar9 = vunpcklps_avx(auVar12,auVar9);
    auVar16 = vunpcklps_avx(auVar13,auVar15);
    auVar12 = vunpckhps_avx(auVar13,auVar15);
    auVar4 = vminps_avx(local_168,local_148);
    auVar5 = vminps_avx(local_128,local_108);
    auVar6 = vminps_avx(auVar4,auVar5);
    auVar4 = vmaxps_avx(auStack_158,auStack_138);
    auVar5 = vmaxps_avx(auStack_118,auStack_f8);
    auVar4 = vmaxps_avx(auVar4,auVar5);
    *(undefined1 (*) [32])(uVar2 + 0x40) = auVar10;
    *(undefined1 (*) [32])(uVar2 + 0x80) = auVar11;
    local_68 = auVar14._0_8_;
    uStack_60 = auVar14._8_8_;
    uStack_58 = auVar14._16_8_;
    uStack_50 = auVar14._24_8_;
    *(undefined8 *)(uVar2 + 0xc0) = local_68;
    *(undefined8 *)(uVar2 + 200) = uStack_60;
    *(undefined8 *)(uVar2 + 0xd0) = uStack_58;
    *(undefined8 *)(uVar2 + 0xd8) = uStack_50;
    *(undefined1 (*) [32])(uVar2 + 0x60) = auVar16;
    *(undefined1 (*) [32])(uVar2 + 0xa0) = auVar12;
    *(undefined1 (*) [32])(uVar2 + 0xe0) = auVar9;
    auVar5 = vminps_avx(local_e8,local_c8);
    auVar7 = vminps_avx(local_a8,local_88);
    auVar5 = vminps_avx(auVar5,auVar7);
    aVar8 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vminps_avx(auVar6,auVar5);
    auVar5 = vmaxps_avx(local_d8,local_b8);
    auVar6 = vmaxps_avx(local_98,local_78);
    auVar5 = vmaxps_avx(auVar5,auVar6);
    aVar3 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vmaxps_avx(auVar4,auVar5);
    (__return_storage_ptr__->lower).field_0 = aVar8;
    (__return_storage_ptr__->upper).field_0 = aVar3;
  }
  else {
    (**this->leafBounds->_vptr_LeafBoundsInterface)(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

BBox3fa BVHNRefitter<N>::recurse_bottom(NodeRef& ref)
    {
      /* this is a leaf node */
      if (unlikely(ref.isLeaf()))
        return leafBounds.leafBounds(ref);
      
      /* recurse if this is an internal node */
      AABBNode* node = ref.getAABBNode();

      /* enable exclusive prefetch for >= AVX platforms */      
#if defined(__AVX__)      
      BVH::prefetchW(ref);
#endif      
      BBox3fa bounds[N];

      for (size_t i=0; i<N; i++)
        if (unlikely(node->child(i) == BVH::emptyNode))
        {
          bounds[i] = BBox3fa(empty);          
        }
      else
        bounds[i] = recurse_bottom(node->child(i));
      
      /* AOS to SOA transform */
      BBox3vf<N> boundsT = transpose<N>(bounds);
      
      /* set new bounds */
      node->lower_x = boundsT.lower.x;
      node->lower_y = boundsT.lower.y;
      node->lower_z = boundsT.lower.z;
      node->upper_x = boundsT.upper.x;
      node->upper_y = boundsT.upper.y;
      node->upper_z = boundsT.upper.z;

      return merge<N>(bounds);
    }